

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double chebyshev1_sample(int *seed)

{
  double dVar1;
  double value;
  double cdf;
  int *seed_local;
  
  dVar1 = r8_uniform_01(seed);
  dVar1 = chebyshev1_cdf_inv(dVar1);
  return dVar1;
}

Assistant:

double chebyshev1_sample ( int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    CHEBYSHEV1_SAMPLE samples the Chebyshev1 PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    01 August 2016
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double CHEBYSHEV1_SAMPLE, a random sample.
//
{
  double cdf;
  double value;

  cdf = r8_uniform_01 ( seed );

  value = chebyshev1_cdf_inv ( cdf );

  return value;
}